

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

boundaries __thiscall fmt::v6::internal::fp::assign_with_boundaries<double>(fp *this,double d)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  char cVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  boundaries bVar10;
  
  uVar8 = (ulong)d & 0xfffffffffffff;
  this->f = uVar8;
  uVar5 = (uint)((ulong)d >> 0x34) & 0x7ff;
  if (uVar5 == 0) {
    this->e = -0x432;
    iVar7 = -0x432;
  }
  else {
    this->f = uVar8 | 0x10000000000000;
    iVar7 = uVar5 - 0x433;
    bVar9 = uVar8 == 0;
    this->e = iVar7;
    uVar8 = uVar8 | 0x10000000000000;
    if (uVar5 != 1 && bVar9) {
      cVar6 = '4' - (char)uVar5;
      cVar4 = (char)uVar5 + -0x35;
      uVar3 = 0x20000000000001;
      lVar2 = 0x3fffffffffffff;
      goto LAB_001700cb;
    }
  }
  cVar6 = (char)iVar7;
  cVar4 = cVar6 + -1;
  uVar3 = uVar8 * 2 + 1;
  lVar2 = uVar8 * 2 + -1;
  if ((uVar8 & 0x10000000000000) == 0) {
    lVar1 = 0x3f;
    if ((uVar3 & 0x1fffffffffffff) != 0) {
      for (; (uVar3 & 0x1fffffffffffff) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar3 = uVar3 << (~(byte)lVar1 + 0x36 & 0x3f);
    cVar6 = (((byte)lVar1 ^ 0x3f) - cVar6) + -9;
  }
  else {
    cVar6 = '\x01' - cVar6;
  }
LAB_001700cb:
  bVar10.lower = lVar2 << (cVar4 + cVar6 + 10U & 0x3f);
  bVar10.upper = uVar3 << 10;
  return bVar10;
}

Assistant:

boundaries assign_with_boundaries(Double d) {
    bool is_lower_closer = assign(d);
    fp lower =
        is_lower_closer ? fp((f << 2) - 1, e - 2) : fp((f << 1) - 1, e - 1);
    // 1 in normalize accounts for the exponent shift above.
    fp upper = normalize<1>(fp((f << 1) + 1, e - 1));
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }